

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Int16_To_Int24(void *destinationBuffer,int destinationStride,void *sourceBuffer,
                   int sourceStride,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  undefined2 uVar1;
  undefined1 *puVar2;
  bool bVar3;
  
  puVar2 = (undefined1 *)((long)destinationBuffer + 2);
  while (bVar3 = count != 0, count = count - 1, bVar3) {
    uVar1 = *sourceBuffer;
    puVar2[-2] = 0;
    puVar2[-1] = (char)uVar1;
    *puVar2 = (char)((ushort)uVar1 >> 8);
    sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 2);
    puVar2 = puVar2 + destinationStride * 3;
  }
  return;
}

Assistant:

static void Int16_To_Int24(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    PaInt16 *src   = (PaInt16*) sourceBuffer;
    unsigned char *dest = (unsigned char*)destinationBuffer;
    PaInt16 temp;

    (void) ditherGenerator; /* unused parameter */

    while( count-- )
    {
        temp = *src;

#if defined(PA_LITTLE_ENDIAN)
        dest[0] = 0;
        dest[1] = (unsigned char)(temp);
        dest[2] = (unsigned char)(temp >> 8);
#elif defined(PA_BIG_ENDIAN)
        dest[0] = (unsigned char)(temp >> 8);
        dest[1] = (unsigned char)(temp);
        dest[2] = 0;
#endif

        src += sourceStride;
        dest += destinationStride * 3;
    }
}